

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::internal::TrackEventCategoryRegistry::DisableCategoryForInstance
          (TrackEventCategoryRegistry *this,size_t category_index,uint32_t instance_index)

{
  LOCK();
  this->state_storage_[category_index].super___atomic_base<unsigned_char>._M_i =
       this->state_storage_[category_index].super___atomic_base<unsigned_char>._M_i &
       ~(byte)(1 << ((byte)instance_index & 0x1f));
  UNLOCK();
  return;
}

Assistant:

void TrackEventCategoryRegistry::DisableCategoryForInstance(
    size_t category_index,
    uint32_t instance_index) const {
  PERFETTO_DCHECK(instance_index < kMaxDataSourceInstances);
  PERFETTO_DCHECK(category_index < category_count_);
  // Matches the acquire_load in DataSource::Trace().
  state_storage_[category_index].fetch_and(
      static_cast<uint8_t>(~(1u << instance_index)), std::memory_order_release);
}